

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_compressionParameters *
ZSTD_getCParams_internal
          (ZSTD_compressionParameters *__return_storage_ptr__,int compressionLevel,
          unsigned_long_long srcSizeHint,size_t dictSize)

{
  ZSTD_compressionParameters cPar;
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  int iVar5;
  ZSTD_compressionParameters *pZVar6;
  ulong local_98;
  ZSTD_compressionParameters cp;
  int row;
  U32 tableID;
  U64 rSize;
  size_t addedSize;
  int unknown;
  size_t dictSize_local;
  unsigned_long_long srcSizeHint_local;
  int compressionLevel_local;
  
  iVar5 = 0;
  if (srcSizeHint == 0xffffffffffffffff && dictSize != 0) {
    iVar5 = 500;
  }
  if ((srcSizeHint == 0xffffffffffffffff) && (dictSize == 0)) {
    local_98 = 0xffffffffffffffff;
  }
  else {
    local_98 = srcSizeHint + dictSize + (long)iVar5;
  }
  cp.targetLength = compressionLevel;
  if (compressionLevel == 0) {
    cp.targetLength = 3;
  }
  if (compressionLevel < 0) {
    cp.targetLength = 0;
  }
  if (0x16 < compressionLevel) {
    cp.targetLength = 0x16;
  }
  pZVar6 = ZSTD_defaultCParameters
           [(uint)(local_98 < 0x40001) + (uint)(local_98 < 0x20001) + (uint)(local_98 < 0x4001)] +
           (int)cp.targetLength;
  uVar1 = pZVar6->windowLog;
  uVar2 = pZVar6->chainLog;
  uVar3 = pZVar6->hashLog;
  uVar4 = pZVar6->searchLog;
  cPar.searchLog = uVar4;
  cPar.hashLog = uVar3;
  cPar.chainLog = uVar2;
  cPar.windowLog = uVar1;
  cp.hashLog = pZVar6->minMatch;
  cp.searchLog = pZVar6->targetLength;
  if (compressionLevel < 0) {
    cp.searchLog = -compressionLevel;
  }
  cPar.minMatch = cp.hashLog;
  cPar.targetLength = cp.searchLog;
  cPar.strategy = pZVar6->strategy;
  ZSTD_adjustCParams_internal(__return_storage_ptr__,cPar,srcSizeHint,dictSize);
  return __return_storage_ptr__;
}

Assistant:

static ZSTD_compressionParameters ZSTD_getCParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize)
{
    int const unknown = srcSizeHint == ZSTD_CONTENTSIZE_UNKNOWN;
    size_t const addedSize = unknown && dictSize > 0 ? 500 : 0;
    U64 const rSize = unknown && dictSize == 0 ? ZSTD_CONTENTSIZE_UNKNOWN : srcSizeHint+dictSize+addedSize;
    U32 const tableID = (rSize <= 256 KB) + (rSize <= 128 KB) + (rSize <= 16 KB);
    int row = compressionLevel;
    DEBUGLOG(5, "ZSTD_getCParams_internal (cLevel=%i)", compressionLevel);
    if (compressionLevel == 0) row = ZSTD_CLEVEL_DEFAULT;   /* 0 == default */
    if (compressionLevel < 0) row = 0;   /* entry 0 is baseline for fast mode */
    if (compressionLevel > ZSTD_MAX_CLEVEL) row = ZSTD_MAX_CLEVEL;
    {   ZSTD_compressionParameters cp = ZSTD_defaultCParameters[tableID][row];
        if (compressionLevel < 0) cp.targetLength = (unsigned)(-compressionLevel);   /* acceleration factor */
        /* refine parameters based on srcSize & dictSize */
        return ZSTD_adjustCParams_internal(cp, srcSizeHint, dictSize);
    }
}